

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O3

bool __thiscall
arangodb::velocypack::Builder::checkAttributeUniquenessSorted(Builder *this,Slice obj)

{
  int iVar1;
  uint8_t *__s1;
  Slice SVar2;
  long lVar3;
  size_t __n;
  ValueLength len;
  Slice previous;
  ObjectIterator it;
  size_t local_50;
  uint8_t *local_48;
  ObjectIterator local_40;
  
  ObjectIterator::ObjectIterator(&local_40,obj,false);
  local_48 = (uint8_t *)ObjectIterator::key(&local_40,true);
  __s1 = (uint8_t *)
         SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getString
                   ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&local_48
                    ,&local_50);
  ObjectIterator::next(&local_40);
  while( true ) {
    SVar2 = ObjectIterator::key(&local_40,true);
    if ((byte)(*SVar2._start - 0x40) < 0x7f) {
      __n = (size_t)(*SVar2._start - 0x40);
      lVar3 = 1;
    }
    else {
      __n = *(size_t *)(SVar2._start + 1);
      lVar3 = 9;
    }
    if ((local_50 == __n) && (iVar1 = bcmp(__s1,SVar2._start + lVar3,__n), iVar1 == 0)) break;
    local_50 = __n;
    ObjectIterator::next(&local_40);
    __s1 = SVar2._start + lVar3;
    if (local_40._position == local_40._size) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Builder::checkAttributeUniquenessSorted(Slice obj) const {
  ObjectIterator it(obj, false);

  // fetch initial key
  Slice previous = it.key(true);
  ValueLength len;
  char const* p = previous.getString(len);

  // advance to next key already
  it.next();

  do {
    Slice const current = it.key(true);
    VELOCYPACK_ASSERT(current.isString());

    ValueLength len2;
    char const* q = current.getStringUnchecked(len2);

    if (len == len2 && std::memcmp(p, q, checkOverflow(len2)) == 0) {
      // identical key
      return false;
    }
    // re-use already calculated values for next round
    len = len2;
    p = q;
    it.next();
  } while (it.valid());

  // all keys unique
  return true;
}